

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O0

void simple_token_tree_describe(simple_token *t,char *string)

{
  char *string_local;
  simple_token *t_local;
  
  fprintf(_stderr,"=====>\n");
  for (string_local = (char *)t; string_local != (char *)0x0;
      string_local = *(char **)(string_local + 0x18)) {
    simple_print_token((simple_token *)string_local,0,string);
  }
  fprintf(_stderr,"<=====\n");
  return;
}

Assistant:

void simple_token_tree_describe(simple_token * t, const char * string) {
	fprintf(stderr, "=====>\n");

	while (t != NULL) {
		simple_print_token(t, 0, string);

		t = t->next;
	}

	fprintf(stderr, "<=====\n");
}